

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O0

string * __thiscall
glcts::(anonymous_namespace)::DrawIndirectBase::BoolToString_abi_cxx11_
          (string *__return_storage_ptr__,DrawIndirectBase *this,GLboolean value)

{
  allocator<char> local_2d [19];
  allocator<char> local_1a;
  GLboolean local_19;
  DrawIndirectBase *pDStack_18;
  GLboolean value_local;
  DrawIndirectBase *this_local;
  
  local_19 = value;
  pDStack_18 = this;
  this_local = (DrawIndirectBase *)__return_storage_ptr__;
  if (value == '\x01') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"GL_TRUE",&local_1a);
    std::allocator<char>::~allocator(&local_1a);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"GL_FALSE",local_2d);
    std::allocator<char>::~allocator(local_2d);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string BoolToString(GLboolean value)
	{
		if (value == GL_TRUE)
			return "GL_TRUE";

		return "GL_FALSE";
	}